

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_DfsLevelizedTfo_rec(Abc_Obj_t *pNode,Vec_Vec_t *vLevels)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if (uVar2 - 5 < 0xfffffffe) {
      if (uVar2 != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x50e,"void Abc_DfsLevelizedTfo_rec(Abc_Obj_t *, Vec_Vec_t *)");
      }
      Vec_VecPush(vLevels,*(uint *)&pNode->field_0x14 >> 0xc,pNode);
      for (lVar3 = 0; lVar3 < (pNode->vFanouts).nSize; lVar3 = lVar3 + 1) {
        Abc_DfsLevelizedTfo_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar3]],vLevels)
        ;
      }
    }
  }
  return;
}

Assistant:

void Abc_DfsLevelizedTfo_rec( Abc_Obj_t * pNode, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the terminals
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) );
    // add the node to the structure
    Vec_VecPush( vLevels, pNode->Level, pNode );
    // visit the TFO
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_DfsLevelizedTfo_rec( pFanout, vLevels );
}